

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O1

uc_err uc_context_reg_read_batch(uc_context *ctx,int *regs,void **vals,int count)

{
  uc_mode mode;
  uc_err uVar1;
  ulong uVar2;
  context_reg_rw_t cVar3;
  size_t size;
  size_t local_38;
  
  mode = ctx->mode;
  cVar3 = find_context_reg_rw(ctx->arch,mode);
  if (0 < count) {
    uVar2 = 0;
    do {
      local_38 = 0xffffffffffffffff;
      uVar1 = (*cVar3.read)(&ctx->field_0x14,mode,regs[uVar2],vals[uVar2],&local_38);
      if (uVar1 != UC_ERR_OK) {
        return uVar1;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)count != uVar2);
  }
  return UC_ERR_OK;
}

Assistant:

UNICORN_EXPORT
uc_err uc_context_reg_read_batch(uc_context *ctx, int *regs, void **vals,
                                 int count)
{
    reg_read_t reg_read = find_context_reg_rw(ctx->arch, ctx->mode).read;
    void *env = ctx->data;
    int mode = ctx->mode;
    int i;

    for (i = 0; i < count; i++) {
        unsigned int regid = regs[i];
        void *value = vals[i];
        size_t size = (size_t)-1;
        uc_err err = reg_read(env, mode, regid, value, &size);
        if (err) {
            return err;
        }
    }

    return UC_ERR_OK;
}